

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON_bool print_value(cJSON *item,printbuffer *output_buffer)

{
  double dVar1;
  byte bVar2;
  uchar uVar3;
  cJSON_bool cVar4;
  uint uVar5;
  cJSON_bool cVar6;
  int iVar7;
  size_t sVar8;
  uchar *puVar9;
  lconv *plVar10;
  ulong uVar11;
  ulong uVar12;
  uchar uVar13;
  cJSON *item_00;
  size_t sVar14;
  long lVar15;
  long in_FS_OFFSET;
  double dVar16;
  uchar number_buffer [26];
  double local_60;
  undefined8 local_58;
  undefined2 uStack_50;
  undefined6 local_4e;
  undefined2 uStack_48;
  undefined8 uStack_46;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar6 = 0;
  cVar4 = 0;
  if (output_buffer != (printbuffer *)0x0 && item != (cJSON *)0x0) {
    bVar2 = (byte)item->type;
    cVar4 = cVar6;
    if (bVar2 < 0x10) {
      switch(bVar2) {
      case 1:
        puVar9 = ensure(output_buffer,6);
        if (puVar9 != (uchar *)0x0) {
          builtin_memcpy(puVar9,"false",6);
LAB_001040fe:
          cVar4 = 1;
        }
        break;
      case 2:
        puVar9 = ensure(output_buffer,5);
        if (puVar9 != (uchar *)0x0) {
          builtin_memcpy(puVar9,"true",5);
          goto LAB_001040fe;
        }
        break;
      case 4:
        puVar9 = ensure(output_buffer,5);
        if (puVar9 != (uchar *)0x0) {
          builtin_memcpy(puVar9,"null",5);
          goto LAB_001040fe;
        }
        break;
      case 8:
        dVar1 = item->valuedouble;
        uStack_48 = 0;
        uStack_46 = 0;
        local_58 = 0;
        uStack_50 = 0;
        local_4e = 0;
        plVar10 = localeconv();
        uVar3 = *plVar10->decimal_point;
        local_60 = 0.0;
        if (NAN(dVar1 - dVar1) || NAN(dVar1)) {
          uVar11 = (ulong)local_58 >> 0x20;
          local_58 = CONCAT44((uint)uVar11 & 0xffffff00,0x6c6c756e);
          uVar5 = 4;
        }
        else if ((dVar1 != (double)item->valueint) || (NAN(dVar1) || NAN((double)item->valueint))) {
          uVar5 = sprintf((char *)&local_58,"%1.15g");
          iVar7 = __isoc99_sscanf(&local_58,"%lg",&local_60);
          if (iVar7 == 1) {
            dVar16 = ABS(local_60);
            if (ABS(local_60) <= ABS(dVar1)) {
              dVar16 = ABS(dVar1);
            }
            if (ABS(local_60 - dVar1) <= dVar16 * 2.220446049250313e-16) goto LAB_00104059;
          }
          uVar5 = sprintf((char *)&local_58,"%1.17g");
        }
        else {
          uVar5 = sprintf((char *)&local_58,"%d");
        }
LAB_00104059:
        cVar4 = 0;
        if (uVar5 < 0x1a) {
          uVar11 = (ulong)uVar5;
          puVar9 = ensure(output_buffer,uVar11 + 1);
          if (puVar9 != (uchar *)0x0) {
            uVar12 = 0;
            if (uVar5 != 0) {
              do {
                uVar13 = *(uchar *)((long)&local_58 + uVar12);
                if (*(uchar *)((long)&local_58 + uVar12) == uVar3) {
                  uVar13 = '.';
                }
                puVar9[uVar12] = uVar13;
                uVar12 = uVar12 + 1;
              } while (uVar11 != uVar12);
            }
            puVar9[uVar12] = '\0';
            output_buffer->offset = output_buffer->offset + uVar11;
            goto LAB_001040fe;
          }
        }
      }
    }
    else if (bVar2 < 0x40) {
      if (bVar2 == 0x10) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          cVar4 = print_string_ptr((uchar *)item->valuestring,output_buffer);
          return cVar4;
        }
        goto LAB_00104122;
      }
      if (bVar2 == 0x20) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          cVar4 = print_array(item,output_buffer);
          return cVar4;
        }
        goto LAB_00104122;
      }
    }
    else if (bVar2 == 0x40) {
      item_00 = item->child;
      uVar11 = (ulong)(output_buffer->format == 0);
      puVar9 = ensure(output_buffer,uVar11 ^ 3);
      if (puVar9 != (uchar *)0x0) {
        *puVar9 = '{';
        output_buffer->depth = output_buffer->depth + 1;
        if (output_buffer->format != 0) {
          puVar9[1] = '\n';
        }
        output_buffer->offset = output_buffer->offset + (2 - uVar11);
        for (; item_00 != (cJSON *)0x0; item_00 = item_00->next) {
          if (output_buffer->format != 0) {
            puVar9 = ensure(output_buffer,output_buffer->depth);
            cVar4 = 0;
            if (puVar9 == (uchar *)0x0) goto switchD_00103cb5_caseD_3;
            uVar11 = output_buffer->depth;
            if (uVar11 != 0) {
              uVar12 = 0;
              do {
                puVar9[uVar12] = '\t';
                uVar12 = uVar12 + 1;
                uVar11 = output_buffer->depth;
              } while (uVar12 < uVar11);
            }
            output_buffer->offset = output_buffer->offset + uVar11;
            if (puVar9 == (uchar *)0x0) goto switchD_00103cb5_caseD_3;
          }
          cVar6 = print_string_ptr((uchar *)item_00->string,output_buffer);
          cVar4 = 0;
          if (cVar6 == 0) goto switchD_00103cb5_caseD_3;
          if (output_buffer->buffer != (uchar *)0x0) {
            sVar14 = output_buffer->offset;
            sVar8 = strlen((char *)(output_buffer->buffer + sVar14));
            output_buffer->offset = sVar8 + sVar14;
          }
          sVar14 = 2 - (ulong)(output_buffer->format == 0);
          puVar9 = ensure(output_buffer,sVar14);
          if (puVar9 == (uchar *)0x0) goto switchD_00103cb5_caseD_3;
          *puVar9 = ':';
          if (output_buffer->format != 0) {
            puVar9[1] = '\t';
          }
          output_buffer->offset = output_buffer->offset + sVar14;
          cVar6 = print_value(item_00,output_buffer);
          if (cVar6 == 0) goto switchD_00103cb5_caseD_3;
          if (output_buffer->buffer != (uchar *)0x0) {
            sVar14 = output_buffer->offset;
            sVar8 = strlen((char *)(output_buffer->buffer + sVar14));
            output_buffer->offset = sVar8 + sVar14;
          }
          lVar15 = ((ulong)(item_00->next != (cJSON *)0x0) + 1) -
                   (ulong)(output_buffer->format == 0);
          puVar9 = ensure(output_buffer,lVar15 + 1);
          if (puVar9 == (uchar *)0x0) goto switchD_00103cb5_caseD_3;
          if (item_00->next != (cJSON *)0x0) {
            *puVar9 = ',';
            puVar9 = puVar9 + 1;
          }
          if (output_buffer->format != 0) {
            *puVar9 = '\n';
            puVar9 = puVar9 + 1;
          }
          *puVar9 = '\0';
          output_buffer->offset = output_buffer->offset + lVar15;
        }
        if (output_buffer->format == 0) {
          sVar14 = 2;
        }
        else {
          sVar14 = output_buffer->depth + 1;
        }
        puVar9 = ensure(output_buffer,sVar14);
        cVar4 = 0;
        if (puVar9 != (uchar *)0x0) {
          if ((output_buffer->format != 0) && (output_buffer->depth != 1)) {
            uVar11 = 0;
            do {
              puVar9[uVar11] = '\t';
              uVar11 = uVar11 + 1;
            } while (uVar11 < output_buffer->depth - 1);
            puVar9 = puVar9 + uVar11;
          }
          puVar9[0] = '}';
          puVar9[1] = '\0';
          output_buffer->depth = output_buffer->depth - 1;
          goto LAB_001040fe;
        }
      }
    }
    else if ((bVar2 == 0x80) && (item->valuestring != (char *)0x0)) {
      sVar8 = strlen(item->valuestring);
      puVar9 = ensure(output_buffer,sVar8 + 1);
      if (puVar9 != (uchar *)0x0) {
        memcpy(puVar9,item->valuestring,sVar8 + 1);
        goto LAB_001040fe;
      }
    }
  }
switchD_00103cb5_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return cVar4;
  }
LAB_00104122:
  __stack_chk_fail();
}

Assistant:

static cJSON_bool print_value(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output = NULL;

    if ((item == NULL) || (output_buffer == NULL))
    {
        return false;
    }

    switch ((item->type) & 0xFF)
    {
        case cJSON_NULL:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "null");
            return true;

        case cJSON_False:
            output = ensure(output_buffer, 6);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "false");
            return true;

        case cJSON_True:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "true");
            return true;

        case cJSON_Number:
            return print_number(item, output_buffer);

        case cJSON_Raw:
        {
            size_t raw_length = 0;
            if (item->valuestring == NULL)
            {
                return false;
            }

            raw_length = strlen(item->valuestring) + sizeof("");
            output = ensure(output_buffer, raw_length);
            if (output == NULL)
            {
                return false;
            }
            memcpy(output, item->valuestring, raw_length);
            return true;
        }

        case cJSON_String:
            return print_string(item, output_buffer);

        case cJSON_Array:
            return print_array(item, output_buffer);

        case cJSON_Object:
            return print_object(item, output_buffer);

        default:
            return false;
    }
}